

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O3

ConsumeResult * __thiscall
binlog::Session::consume<std::ofstream>
          (ConsumeResult *__return_storage_ptr__,Session *this,
          basic_ofstream<char,_std::char_traits<char>_> *out)

{
  pointer pcVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar8;
  pointer psVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar15;
  ulong uVar16;
  pointer pcVar17;
  uint64_t uVar18;
  bool bVar19;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    uVar8 = std::__throw_system_error(iVar6);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar8);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    std::ostream::write((char *)out,
                        (long)((this->_clockSync)._vector.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18));
    pcVar17 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (-0x18 - (long)(this->_clockSync)._vector.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    __return_storage_ptr__->bytesConsumed = (size_t)pcVar17;
    this->_consumeClockSync = false;
  }
  else {
    pcVar17 = (pointer)0x0;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = (-(long)pcVar1 - this->_sourcesConsumePos) + -0x18;
  std::ostream::write((char *)out,(long)(pcVar1 + this->_sourcesConsumePos + 0x18));
  this->_sourcesConsumePos = (streamsize)(pcVar2 + this->_sourcesConsumePos + lVar12);
  __return_storage_ptr__->bytesConsumed = (size_t)(pcVar2 + (long)(pcVar17 + lVar12));
  psVar15 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (this->_channels).
           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar15 != psVar9) {
    do {
      p_Var3 = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = p_Var3->_M_use_count == 1;
      }
      entry = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
      _Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>;
      uVar5 = *(ulong *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
      uVar16 = *(ulong *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
      if (uVar5 < uVar16) {
        lVar12 = *(long *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
        uVar10 = *(ulong *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) -
                 uVar16;
        uVar11 = uVar5;
        if (*(ulong *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) <
            uVar16 || uVar10 == 0) goto LAB_001030a2;
        uVar11 = uVar10;
        lVar13 = uVar16 + lVar12;
        lVar14 = lVar12;
        uVar16 = uVar5;
      }
      else {
        lVar12 = uVar16 + *(long *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl +
                                   0x28);
        uVar11 = uVar5 - uVar16;
LAB_001030a2:
        uVar16 = 0;
        lVar14 = 0;
        lVar13 = lVar12;
      }
      uVar18 = uVar16 + uVar11;
      if (uVar18 != 0) {
        (entry->writerProp).batchSize = uVar18;
        sVar7 = consumeSpecialEntry<binlog::WriterProp,std::ofstream>(this,&entry->writerProp,out);
        sVar7 = sVar7 + __return_storage_ptr__->bytesConsumed;
        __return_storage_ptr__->bytesConsumed = sVar7;
        std::ostream::write((char *)out,lVar13);
        if (uVar16 != 0) {
          std::ostream::write((char *)out,lVar14);
        }
        *(ulong *)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = uVar5;
        __return_storage_ptr__->bytesConsumed = sVar7 + uVar18;
      }
      if (bVar19) {
        p_Var3 = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
        (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
      }
      __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar9);
    psVar15 = (this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar9 = (this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<std::ofstream>(std::ofstream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                      (psVar15,psVar9);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::_M_erase(&this->_channels,(iterator)__first._M_current,
             (this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  sVar7 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
  this->_totalConsumedBytes = sVar7;
  __return_storage_ptr__->totalBytesConsumed = sVar7;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}